

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

void __thiscall udpdiscovery::impl::PeerEnv::PeerEnv(PeerEnv *this)

{
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_0010bd10;
  PeerParameters::PeerParameters(&this->parameters_);
  this->binding_sock_ = -1;
  this->sock_ = -1;
  this->packet_index_ = 0;
  MinimalisticMutex::MinimalisticMutex(&this->lock_);
  this->ref_count_ = 0;
  this->exit_ = false;
  (this->user_data_)._M_dataplus._M_p = (pointer)&(this->user_data_).field_2;
  (this->user_data_)._M_string_length = 0;
  (this->user_data_).field_2._M_local_buf[0] = '\0';
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->discovered_peers_;
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->discovered_peers_;
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node._M_size = 0;
  return;
}

Assistant:

PeerEnv()
      : binding_sock_(kInvalidSocket),
        sock_(kInvalidSocket),
        packet_index_(0),
        ref_count_(0),
        exit_(false) {}